

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zgstrs.c
# Opt level: O3

void zgstrs(trans_t trans,SuperMatrix *L,SuperMatrix *U,int *perm_c,int *perm_r,SuperMatrix *B,
           SuperLUStat_t *stat,int *info)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint *puVar6;
  doublecomplex *pdVar7;
  void *pvVar8;
  void *pvVar9;
  long lVar10;
  bool bVar11;
  doublecomplex dVar12;
  doublecomplex dVar13;
  doublecomplex dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  undefined8 uVar18;
  ulong uVar19;
  doublecomplex *Mxvec;
  doublecomplex *addr;
  ulong uVar20;
  long lVar21;
  doublecomplex *pdVar22;
  long lVar23;
  long lVar24;
  ulong n;
  uint uVar25;
  int iVar26;
  int iVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  int iVar31;
  int iVar32;
  ulong uVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  double *pdVar38;
  float fVar39;
  ulong local_198;
  int ii;
  
  *info = 0;
  if (CONJ < trans) {
    ii = 1;
    iVar26 = -1;
LAB_001066cc:
    *info = iVar26;
    input_error("zgstrs",&ii);
    return;
  }
  uVar3 = L->nrow;
  n = (ulong)uVar3;
  ii = 2;
  iVar26 = -2;
  if (((((int)uVar3 < 0) || (uVar3 != L->ncol)) || (L->Stype != SLU_SC)) ||
     ((L->Dtype != SLU_Z || (L->Mtype != SLU_TRLU)))) goto LAB_001066cc;
  ii = 3;
  iVar26 = -3;
  if (((U->nrow < 0) || ((U->nrow != U->ncol || (U->Stype != SLU_NC)))) ||
     ((U->Dtype != SLU_Z || (U->Mtype != SLU_TRU)))) goto LAB_001066cc;
  puVar6 = (uint *)B->Store;
  uVar25 = *puVar6;
  lVar23 = (long)(int)uVar25;
  ii = 6;
  iVar26 = -6;
  if (((((int)uVar25 < (int)uVar3) || (B->Stype != SLU_DN)) || (B->Dtype != SLU_Z)) ||
     (B->Mtype != SLU_GE)) goto LAB_001066cc;
  uVar4 = B->ncol;
  uVar19 = (ulong)uVar4;
  Mxvec = doublecomplexCalloc((long)(int)uVar4 * n);
  if (Mxvec == (doublecomplex *)0x0) {
    sprintf((char *)&ii,"%s at line %d in file %s\n","Malloc fails for local work[].",0x8d,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zgstrs.c");
    superlu_abort_and_exit((char *)&ii);
  }
  addr = doublecomplexMalloc(n);
  if (addr == (doublecomplex *)0x0) {
    sprintf((char *)&ii,"%s at line %d in file %s\n","Malloc fails for local soln[].",0x8f,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zgstrs.c");
    superlu_abort_and_exit((char *)&ii);
  }
  pdVar7 = *(doublecomplex **)(puVar6 + 2);
  if (trans == NOTRANS) {
    pvVar8 = L->Store;
    lVar24 = *(long *)((long)pvVar8 + 8);
    pvVar9 = U->Store;
    lVar10 = *(long *)((long)pvVar9 + 8);
    if (0 < (int)uVar4) {
      uVar20 = 0;
      pdVar22 = pdVar7;
      do {
        if (uVar3 != 0) {
          lVar30 = 0;
          do {
            iVar26 = *(int *)((long)perm_r + lVar30);
            pdVar38 = (double *)((long)&pdVar22->r + lVar30 * 4);
            dVar15 = pdVar38[1];
            addr[iVar26].r = *pdVar38;
            addr[iVar26].i = dVar15;
            lVar30 = lVar30 + 4;
          } while (n * 4 - lVar30 != 0);
          if (uVar3 != 0) {
            lVar30 = 0;
            do {
              puVar1 = (undefined8 *)((long)&addr->r + lVar30);
              uVar18 = puVar1[1];
              puVar2 = (undefined8 *)((long)&pdVar22->r + lVar30);
              *puVar2 = *puVar1;
              puVar2[1] = uVar18;
              lVar30 = lVar30 + 0x10;
            } while (n << 4 != lVar30);
          }
        }
        uVar20 = uVar20 + 1;
        pdVar22 = pdVar22 + uVar25;
      } while (uVar20 != uVar19);
    }
    if ((int)*(uint *)((long)pvVar8 + 4) < 0) {
      fVar39 = 0.0;
    }
    else {
      uVar20 = (ulong)*(uint *)((long)pvVar8 + 4);
      fVar39 = 0.0;
      lVar30 = 0;
      do {
        lVar21 = (long)*(int *)(*(long *)((long)pvVar8 + 0x30) + lVar30 * 4);
        uVar25 = *(uint *)(*(long *)((long)pvVar8 + 0x20) + lVar21 * 4);
        iVar26 = *(int *)(*(long *)((long)pvVar8 + 0x20) + 4 + lVar21 * 4);
        iVar31 = iVar26 - uVar25;
        lVar28 = *(int *)(*(long *)((long)pvVar8 + 0x30) + 4 + lVar30 * 4) - lVar21;
        iVar27 = (int)lVar28;
        iVar32 = iVar31 - iVar27;
        if (iVar27 == 1) {
          if (0 < (int)uVar4) {
            iVar31 = *(int *)(*(long *)((long)pvVar8 + 0x10) + lVar21 * 4);
            uVar33 = 0;
            do {
              if ((int)(uVar25 + 1) < iVar26) {
                lVar34 = uVar33 * lVar23;
                lVar28 = *(long *)((long)pvVar8 + 0x18);
                lVar37 = 0;
                pdVar38 = (double *)((long)iVar31 * 0x10 + lVar24 + 0x18);
                do {
                  lVar35 = (long)*(int *)(lVar28 + (long)(int)uVar25 * 4 + 4 + lVar37 * 4);
                  dVar16 = pdVar7[lVar34 + lVar21].r;
                  dVar17 = pdVar7[lVar34 + lVar21].i;
                  dVar15 = pdVar7[lVar34 + lVar35].i - (pdVar38[-1] * dVar17 + dVar16 * *pdVar38);
                  dVar12.i._0_4_ = SUB84(dVar15,0);
                  dVar12.r = pdVar7[lVar34 + lVar35].r - (pdVar38[-1] * dVar16 + -dVar17 * *pdVar38)
                  ;
                  dVar12.i._4_4_ = (int)((ulong)dVar15 >> 0x20);
                  pdVar7[lVar34 + lVar35] = dVar12;
                  pdVar38 = pdVar38 + 2;
                  lVar37 = lVar37 + 1;
                } while (~uVar25 + iVar26 != (int)lVar37);
              }
              uVar33 = uVar33 + 1;
            } while (uVar33 != uVar19);
          }
        }
        else if (0 < (int)uVar4) {
          lVar34 = (long)*(int *)(*(long *)((long)pvVar8 + 0x10) + lVar21 * 4);
          uVar20 = 0;
          do {
            lVar37 = uVar20 * lVar23;
            zlsolve(iVar31,iVar27,(doublecomplex *)(lVar34 * 0x10 + lVar24),pdVar7 + lVar37 + lVar21
                   );
            zmatvec(iVar31,iVar32,iVar27,(doublecomplex *)((lVar28 + lVar34) * 0x10 + lVar24),
                    pdVar7 + lVar37 + lVar21,Mxvec);
            if (0 < iVar32) {
              lVar35 = *(long *)((long)pvVar8 + 0x18);
              lVar36 = 0;
              pdVar22 = Mxvec;
              do {
                lVar29 = (long)*(int *)(lVar35 + (long)(int)(uVar25 + iVar27) * 4 + lVar36 * 4);
                dVar15 = pdVar7[lVar37 + lVar29].i - pdVar22->i;
                dVar14.i._0_4_ = SUB84(dVar15,0);
                dVar14.r = pdVar7[lVar37 + lVar29].r - pdVar22->r;
                dVar14.i._4_4_ = (int)((ulong)dVar15 >> 0x20);
                pdVar7[lVar37 + lVar29] = dVar14;
                lVar36 = lVar36 + 1;
                pdVar22->r = 0.0;
                pdVar22->i = 0.0;
                pdVar22 = pdVar22 + 1;
              } while (lVar36 < iVar32);
            }
            uVar20 = uVar20 + 1;
          } while (uVar20 != uVar19);
          uVar20 = (ulong)*(uint *)((long)pvVar8 + 4);
        }
        fVar39 = (float)(int)(uVar4 * 8 * iVar27 * iVar32) +
                 fVar39 + (float)(int)(uVar4 * 4 * iVar27 * (iVar27 + -1));
        bVar11 = lVar30 < (int)uVar20;
        lVar30 = lVar30 + 1;
      } while (bVar11);
      if (-1 < (int)uVar20) {
        do {
          iVar26 = *(int *)(*(long *)((long)pvVar8 + 0x30) + uVar20 * 4);
          lVar21 = (long)iVar26;
          iVar27 = *(int *)(*(long *)((long)pvVar8 + 0x30) + 4 + uVar20 * 4);
          iVar31 = iVar27 - iVar26;
          lVar30 = (long)*(int *)(*(long *)((long)pvVar8 + 0x10) + lVar21 * 4);
          fVar39 = (float)(int)(uVar4 * 4 * iVar31 * (iVar31 + 1)) + fVar39;
          if (iVar31 == 1) {
            if (0 < (int)uVar4) {
              pdVar22 = pdVar7 + lVar21;
              uVar33 = uVar19;
              do {
                z_div(pdVar22,pdVar22,(doublecomplex *)(lVar30 * 0x10 + lVar24));
                pdVar22 = pdVar22 + lVar23;
                uVar25 = (int)uVar33 - 1;
                uVar33 = (ulong)uVar25;
              } while (uVar25 != 0);
LAB_00106e62:
              if (0 < (int)uVar4) {
                uVar33 = 0;
                do {
                  if (iVar26 < iVar27) {
                    lVar34 = uVar33 * lVar23;
                    lVar30 = *(long *)((long)pvVar9 + 0x18);
                    lVar28 = lVar21;
                    iVar31 = *(int *)(lVar30 + lVar21 * 4);
                    do {
                      iVar32 = *(int *)(lVar30 + 4 + lVar28 * 4);
                      if (iVar32 - iVar31 != 0 && iVar31 <= iVar32) {
                        lVar37 = *(long *)((long)pvVar9 + 0x10);
                        lVar35 = (long)iVar31;
                        pdVar38 = (double *)(lVar35 * 0x10 + lVar10 + 8);
                        do {
                          lVar36 = (long)*(int *)(lVar37 + lVar35 * 4);
                          dVar16 = pdVar7[lVar34 + lVar28].r;
                          dVar17 = pdVar7[lVar34 + lVar28].i;
                          dVar15 = pdVar7[lVar34 + lVar36].i -
                                   (pdVar38[-1] * dVar17 + dVar16 * *pdVar38);
                          dVar13.i._0_4_ = SUB84(dVar15,0);
                          dVar13.r = pdVar7[lVar34 + lVar36].r -
                                     (pdVar38[-1] * dVar16 + -dVar17 * *pdVar38);
                          dVar13.i._4_4_ = (int)((ulong)dVar15 >> 0x20);
                          pdVar7[lVar34 + lVar36] = dVar13;
                          lVar35 = lVar35 + 1;
                          pdVar38 = pdVar38 + 2;
                        } while (iVar32 != lVar35);
                      }
                      lVar28 = lVar28 + 1;
                      fVar39 = fVar39 + (float)((iVar32 - iVar31) * 8);
                      iVar31 = iVar32;
                    } while (lVar28 != iVar27);
                  }
                  uVar33 = uVar33 + 1;
                } while (uVar33 != uVar19);
              }
            }
          }
          else if (0 < (int)uVar4) {
            iVar32 = *(int *)(*(long *)((long)pvVar8 + 0x20) + 4 + lVar21 * 4);
            iVar5 = *(int *)(*(long *)((long)pvVar8 + 0x20) + lVar21 * 4);
            pdVar22 = pdVar7 + lVar21;
            uVar33 = uVar19;
            do {
              zusolve(iVar32 - iVar5,iVar31,(doublecomplex *)(lVar30 * 0x10 + lVar24),pdVar22);
              pdVar22 = pdVar22 + lVar23;
              uVar33 = uVar33 - 1;
            } while (uVar33 != 0);
            goto LAB_00106e62;
          }
          bVar11 = 0 < (long)uVar20;
          uVar20 = uVar20 - 1;
        } while (bVar11);
      }
    }
    if (0 < (int)uVar4) {
      uVar20 = 0;
      pdVar22 = pdVar7;
      do {
        if (0 < (int)uVar3) {
          lVar24 = 0;
          do {
            dVar15 = pdVar7[uVar20 * lVar23 + (long)*(int *)((long)perm_c + lVar24)].i;
            pdVar38 = (double *)((long)&addr->r + lVar24 * 4);
            *pdVar38 = pdVar7[uVar20 * lVar23 + (long)*(int *)((long)perm_c + lVar24)].r;
            pdVar38[1] = dVar15;
            lVar24 = lVar24 + 4;
          } while (n * 4 - lVar24 != 0);
          if (0 < (int)uVar3) {
            lVar24 = 0;
            do {
              puVar1 = (undefined8 *)((long)&addr->r + lVar24);
              uVar18 = puVar1[1];
              puVar2 = (undefined8 *)((long)&pdVar22->r + lVar24);
              *puVar2 = *puVar1;
              puVar2[1] = uVar18;
              lVar24 = lVar24 + 0x10;
            } while (n << 4 != lVar24);
          }
        }
        uVar20 = uVar20 + 1;
        pdVar22 = pdVar22 + lVar23;
      } while (uVar20 != uVar19);
    }
  }
  else {
    if (0 < (int)uVar4) {
      uVar20 = 0;
      pdVar22 = pdVar7;
      do {
        if (n != 0) {
          lVar24 = 0;
          do {
            iVar26 = *(int *)((long)perm_c + lVar24);
            pdVar38 = (double *)((long)&pdVar22->r + lVar24 * 4);
            dVar15 = pdVar38[1];
            addr[iVar26].r = *pdVar38;
            addr[iVar26].i = dVar15;
            lVar24 = lVar24 + 4;
          } while (n * 4 - lVar24 != 0);
          if (n != 0) {
            lVar24 = 0;
            do {
              puVar1 = (undefined8 *)((long)&addr->r + lVar24);
              uVar18 = puVar1[1];
              puVar2 = (undefined8 *)((long)&pdVar22->r + lVar24);
              *puVar2 = *puVar1;
              puVar2[1] = uVar18;
              lVar24 = lVar24 + 0x10;
            } while (n << 4 != lVar24);
          }
        }
        uVar20 = uVar20 + 1;
        pdVar22 = pdVar22 + uVar25;
      } while (uVar20 != uVar19);
      stat->ops[0x11] = 0.0;
      local_198 = uVar19;
      if (trans == TRANS) {
        pdVar22 = pdVar7;
        if ((int)uVar4 < 1) goto LAB_00107160;
        do {
          sp_ztrsv("U","T","N",L,U,pdVar22,stat,info);
          sp_ztrsv("L","T","U",L,U,pdVar22,stat,info);
          local_198 = local_198 - 1;
          pdVar22 = pdVar22 + lVar23;
        } while (local_198 != 0);
      }
      else {
        pdVar22 = pdVar7;
        if ((int)uVar4 < 1) goto LAB_00107160;
        do {
          sp_ztrsv("U","C","N",L,U,pdVar22,stat,info);
          sp_ztrsv("L","C","U",L,U,pdVar22,stat,info);
          local_198 = local_198 - 1;
          pdVar22 = pdVar22 + lVar23;
        } while (local_198 != 0);
      }
      if (0 < (int)uVar4) {
        uVar20 = 0;
        pdVar22 = pdVar7;
        do {
          if (0 < (int)uVar3) {
            lVar24 = 0;
            do {
              dVar15 = pdVar7[uVar20 * lVar23 + (long)*(int *)((long)perm_r + lVar24)].i;
              pdVar38 = (double *)((long)&addr->r + lVar24 * 4);
              *pdVar38 = pdVar7[uVar20 * lVar23 + (long)*(int *)((long)perm_r + lVar24)].r;
              pdVar38[1] = dVar15;
              lVar24 = lVar24 + 4;
            } while (n * 4 != lVar24);
            if (0 < (int)uVar3) {
              lVar24 = 0;
              do {
                puVar1 = (undefined8 *)((long)&addr->r + lVar24);
                uVar18 = puVar1[1];
                puVar2 = (undefined8 *)((long)&pdVar22->r + lVar24);
                *puVar2 = *puVar1;
                puVar2[1] = uVar18;
                lVar24 = lVar24 + 0x10;
              } while (n << 4 != lVar24);
            }
          }
          uVar20 = uVar20 + 1;
          pdVar22 = pdVar22 + lVar23;
        } while (uVar20 != uVar19);
      }
      goto LAB_00107160;
    }
    fVar39 = 0.0;
  }
  stat->ops[0x11] = fVar39;
LAB_00107160:
  superlu_free(Mxvec);
  superlu_free(addr);
  return;
}

Assistant:

void
zgstrs (trans_t trans, SuperMatrix *L, SuperMatrix *U,
        const int *perm_c, const int *perm_r, SuperMatrix *B,
        SuperLUStat_t *stat, int *info)
{

#ifdef _CRAY
    _fcd ftcs1, ftcs2, ftcs3, ftcs4;
#endif
#ifdef USE_VENDOR_BLAS
    doublecomplex   alpha = {1.0, 0.0}, beta = {1.0, 0.0};
    doublecomplex   *work_col;
#endif
    doublecomplex   temp_comp;
    DNformat *Bstore;
    doublecomplex   *Bmat;
    SCformat *Lstore;
    NCformat *Ustore;
    doublecomplex   *Lval, *Uval;
    int      fsupc, nrow, nsupr, nsupc, irow;
    int_t    i, j, k, luptr, istart, iptr;
    int      jcol, n, ldb, nrhs;
    doublecomplex   *work, *rhs_work, *soln;
    flops_t  solve_ops;
    void zprint_soln(int n, int nrhs, const doublecomplex *soln);

    /* Test input parameters ... */
    *info = 0;
    Bstore = B->Store;
    ldb = Bstore->lda;
    nrhs = B->ncol;
    if ( trans != NOTRANS && trans != TRANS && trans != CONJ ) *info = -1;
    else if ( L->nrow != L->ncol || L->nrow < 0 ||
	      L->Stype != SLU_SC || L->Dtype != SLU_Z || L->Mtype != SLU_TRLU )
	*info = -2;
    else if ( U->nrow != U->ncol || U->nrow < 0 ||
	      U->Stype != SLU_NC || U->Dtype != SLU_Z || U->Mtype != SLU_TRU )
	*info = -3;
    else if ( ldb < SUPERLU_MAX(0, L->nrow) ||
	      B->Stype != SLU_DN || B->Dtype != SLU_Z || B->Mtype != SLU_GE )
	*info = -6;
    if ( *info ) {
	int ii = -(*info);
	input_error("zgstrs", &ii);
	return;
    }

    n = L->nrow;
    work = doublecomplexCalloc((size_t) n * (size_t) nrhs);
    if ( !work ) ABORT("Malloc fails for local work[].");
    soln = doublecomplexMalloc((size_t) n);
    if ( !soln ) ABORT("Malloc fails for local soln[].");

    Bmat = Bstore->nzval;
    Lstore = L->Store;
    Lval = Lstore->nzval;
    Ustore = U->Store;
    Uval = Ustore->nzval;
    solve_ops = 0;
    
    if ( trans == NOTRANS ) {
	/* Permute right hand sides to form Pr*B */
	for (i = 0; i < nrhs; i++) {
	    rhs_work = &Bmat[(size_t)i * (size_t)ldb];
	    for (k = 0; k < n; k++) soln[perm_r[k]] = rhs_work[k];
	    for (k = 0; k < n; k++) rhs_work[k] = soln[k];
	}
	
	/* Forward solve PLy=Pb. */
	for (k = 0; k <= Lstore->nsuper; k++) {
	    fsupc = L_FST_SUPC(k);
	    istart = L_SUB_START(fsupc);
	    nsupr = L_SUB_START(fsupc+1) - istart;
	    nsupc = L_FST_SUPC(k+1) - fsupc;
	    nrow = nsupr - nsupc;

	    solve_ops += 4 * nsupc * (nsupc - 1) * nrhs;
	    solve_ops += 8 * nrow * nsupc * nrhs;
	    
	    if ( nsupc == 1 ) {
		for (j = 0; j < nrhs; j++) {
		    rhs_work = &Bmat[(size_t)j * (size_t)ldb];
	    	    luptr = L_NZ_START(fsupc);
		    for (iptr=istart+1; iptr < L_SUB_START(fsupc+1); iptr++){
			irow = L_SUB(iptr);
			++luptr;
			zz_mult(&temp_comp, &rhs_work[fsupc], &Lval[luptr]);
			z_sub(&rhs_work[irow], &rhs_work[irow], &temp_comp);
		    }
		}
	    } else {
	    	luptr = L_NZ_START(fsupc);
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		ftcs1 = _cptofcd("L", strlen("L"));
		ftcs2 = _cptofcd("N", strlen("N"));
		ftcs3 = _cptofcd("U", strlen("U"));
		CTRSM( ftcs1, ftcs1, ftcs2, ftcs3, &nsupc, &nrhs, &alpha,
		       &Lval[luptr], &nsupr, &Bmat[fsupc], &ldb);
		
		CGEMM( ftcs2, ftcs2, &nrow, &nrhs, &nsupc, &alpha, 
			&Lval[luptr+nsupc], &nsupr, &Bmat[fsupc], &ldb, 
			&beta, &work[0], &n );
#else
		ztrsm_("L", "L", "N", "U", &nsupc, &nrhs, &alpha,
		       &Lval[luptr], &nsupr, &Bmat[fsupc], &ldb);
		
		zgemm_( "N", "N", &nrow, &nrhs, &nsupc, &alpha, 
			&Lval[luptr+nsupc], &nsupr, &Bmat[fsupc], &ldb, 
			&beta, &work[0], &n );
#endif
		for (j = 0; j < nrhs; j++) {
		    rhs_work = &Bmat[(size_t)j * (size_t)ldb];
		    work_col = &work[(size_t)j * (size_t)n];
		    iptr = istart + nsupc;
		    for (i = 0; i < nrow; i++) {
			irow = L_SUB(iptr);
			z_sub(&rhs_work[irow], &rhs_work[irow], &work_col[i]);
			work_col[i].r = 0.0;
	                work_col[i].i = 0.0;
			iptr++;
		    }
		}
#else		
		for (j = 0; j < nrhs; j++) {
		    rhs_work = &Bmat[(size_t)j * (size_t)ldb];
		    zlsolve (nsupr, nsupc, &Lval[luptr], &rhs_work[fsupc]);
		    zmatvec (nsupr, nrow, nsupc, &Lval[luptr+nsupc],
			    &rhs_work[fsupc], &work[0] );

		    iptr = istart + nsupc;
		    for (i = 0; i < nrow; i++) {
			irow = L_SUB(iptr);
			z_sub(&rhs_work[irow], &rhs_work[irow], &work[i]);
			work[i].r = 0.;
	                work[i].i = 0.;
			iptr++;
		    }
		}
#endif		    
	    } /* else ... */
	} /* for L-solve */

#if ( DEBUGlevel>=2 )
  	printf("After L-solve: y=\n");
	zprint_soln(n, nrhs, Bmat);
#endif

	/*
	 * Back solve Ux=y.
	 */
	for (k = Lstore->nsuper; k >= 0; k--) {
	    fsupc = L_FST_SUPC(k);
	    istart = L_SUB_START(fsupc);
	    nsupr = L_SUB_START(fsupc+1) - istart;
	    nsupc = L_FST_SUPC(k+1) - fsupc;
	    luptr = L_NZ_START(fsupc);

	    solve_ops += 4 * nsupc * (nsupc + 1) * nrhs;

	    if ( nsupc == 1 ) {
		rhs_work = &Bmat[0];
		for (j = 0; j < nrhs; j++) {
		    z_div(&rhs_work[fsupc], &rhs_work[fsupc], &Lval[luptr]);
		    rhs_work += ldb;
		}
	    } else {
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		ftcs1 = _cptofcd("L", strlen("L"));
		ftcs2 = _cptofcd("U", strlen("U"));
		ftcs3 = _cptofcd("N", strlen("N"));
		CTRSM( ftcs1, ftcs2, ftcs3, ftcs3, &nsupc, &nrhs, &alpha,
		       &Lval[luptr], &nsupr, &Bmat[fsupc], &ldb);
#else
		ztrsm_("L", "U", "N", "N", &nsupc, &nrhs, &alpha,
		       &Lval[luptr], &nsupr, &Bmat[fsupc], &ldb);
#endif
#else		
		for (j = 0; j < nrhs; j++)
		    zusolve ( nsupr, nsupc, &Lval[luptr], &Bmat[(size_t)fsupc + (size_t)j * (size_t)ldb] );
#endif		
	    }

	    for (j = 0; j < nrhs; ++j) {
		rhs_work = &Bmat[(size_t)j * (size_t)ldb];
		for (jcol = fsupc; jcol < fsupc + nsupc; jcol++) {
		    solve_ops += 8*(U_NZ_START(jcol+1) - U_NZ_START(jcol));
		    for (i = U_NZ_START(jcol); i < U_NZ_START(jcol+1); i++ ){
			irow = U_SUB(i);
			zz_mult(&temp_comp, &rhs_work[jcol], &Uval[i]);
			z_sub(&rhs_work[irow], &rhs_work[irow], &temp_comp);
		    }
		}
	    }
	    
	} /* for U-solve */

#if ( DEBUGlevel>=2 )
  	printf("After U-solve: x=\n");
	zprint_soln(n, nrhs, Bmat);
#endif

	/* Compute the final solution X := Pc*X. */
	for (i = 0; i < nrhs; i++) {
	    rhs_work = &Bmat[(size_t)i * (size_t)ldb];
	    for (k = 0; k < n; k++) soln[k] = rhs_work[perm_c[k]];
	    for (k = 0; k < n; k++) rhs_work[k] = soln[k];
	}
	
        stat->ops[SOLVE] = solve_ops;

    } else { /* Solve A'*X=B or CONJ(A)*X=B */
	/* Permute right hand sides to form Pc'*B. */
	for (i = 0; i < nrhs; i++) {
	    rhs_work = &Bmat[(size_t)i * (size_t)ldb];
	    for (k = 0; k < n; k++) soln[perm_c[k]] = rhs_work[k];
	    for (k = 0; k < n; k++) rhs_work[k] = soln[k];
	}

	stat->ops[SOLVE] = 0;
        if (trans == TRANS) {
	    for (k = 0; k < nrhs; ++k) {
	        /* Multiply by inv(U'). */
	        sp_ztrsv("U", "T", "N", L, U, &Bmat[(size_t)k * (size_t)ldb], stat, info);
	    
	        /* Multiply by inv(L'). */
	        sp_ztrsv("L", "T", "U", L, U, &Bmat[(size_t)k * (size_t)ldb], stat, info);
	    }
         } else { /* trans == CONJ */
            for (k = 0; k < nrhs; ++k) {                
                /* Multiply by conj(inv(U')). */
                sp_ztrsv("U", "C", "N", L, U, &Bmat[(size_t)k * (size_t)ldb], stat, info);
                
                /* Multiply by conj(inv(L')). */
                sp_ztrsv("L", "C", "U", L, U, &Bmat[(size_t)k * (size_t)ldb], stat, info);
	    }
         }
	/* Compute the final solution X := Pr'*X (=inv(Pr)*X) */
	for (i = 0; i < nrhs; i++) {
	    rhs_work = &Bmat[(size_t)i * (size_t)ldb];
	    for (k = 0; k < n; k++) soln[k] = rhs_work[perm_r[k]];
	    for (k = 0; k < n; k++) rhs_work[k] = soln[k];
	}

    }

    SUPERLU_FREE(work);
    SUPERLU_FREE(soln);
}